

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

ERR_STATE * err_get_state(void)

{
  int iVar1;
  ERR_STATE *local_18;
  ERR_STATE *state;
  
  local_18 = (ERR_STATE *)CRYPTO_get_thread_local(OPENSSL_THREAD_LOCAL_ERR);
  if (local_18 == (ERR_STATE *)0x0) {
    local_18 = (ERR_STATE *)malloc(400);
    if (local_18 == (ERR_STATE *)0x0) {
      return (ERR_STATE *)0x0;
    }
    OPENSSL_memset(local_18,0,400);
    iVar1 = CRYPTO_set_thread_local(OPENSSL_THREAD_LOCAL_ERR,local_18,err_state_free);
    if (iVar1 == 0) {
      return (ERR_STATE *)0x0;
    }
  }
  return local_18;
}

Assistant:

static ERR_STATE *err_get_state(void) {
  ERR_STATE *state = reinterpret_cast<ERR_STATE *>(
      CRYPTO_get_thread_local(OPENSSL_THREAD_LOCAL_ERR));
  if (state == NULL) {
    state = reinterpret_cast<ERR_STATE *>(malloc(sizeof(ERR_STATE)));
    if (state == NULL) {
      return NULL;
    }
    OPENSSL_memset(state, 0, sizeof(ERR_STATE));
    if (!CRYPTO_set_thread_local(OPENSSL_THREAD_LOCAL_ERR, state,
                                 err_state_free)) {
      return NULL;
    }
  }

  return state;
}